

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t zip_read_data_zipx_xz(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  zip *zip;
  uint64_t uVar1;
  size_t sVar2;
  bool bVar3;
  lzma_ret lVar4;
  wchar_t wVar5;
  size_t in_RAX;
  uchar *puVar6;
  uint8_t *puVar7;
  ulong uVar8;
  char *pcVar9;
  int error_number;
  ssize_t bytes_avail;
  size_t local_38;
  
  zip = (zip *)a->format->data;
  local_38 = in_RAX;
  if (zip->decompress_init == '\0') {
    if (zip->zipx_lzma_valid != '\0') {
      lzma_end(&zip->zipx_lzma_stream);
      zip->zipx_lzma_valid = '\0';
    }
    memset(&zip->zipx_lzma_stream,0,0x88);
    lVar4 = lzma_stream_decoder(&zip->zipx_lzma_stream,0xffffffffffffffff,0);
    if (lVar4 == LZMA_OK) {
      zip->zipx_lzma_valid = '\x01';
      free(zip->uncompressed_buffer);
      zip->uncompressed_buffer_size = 0x40000;
      puVar6 = (uchar *)malloc(0x40000);
      zip->uncompressed_buffer = puVar6;
      if (puVar6 == (uchar *)0x0) {
        bVar3 = false;
        archive_set_error(&a->archive,0xc,"No memory for xz decompression");
        wVar5 = L'\xffffffe2';
      }
      else {
        zip->decompress_init = '\x01';
        wVar5 = L'\0';
        bVar3 = true;
      }
    }
    else {
      bVar3 = false;
      archive_set_error(&a->archive,-1,"xz initialization failed(%d)",(ulong)lVar4);
      wVar5 = L'\xffffffe7';
    }
    if (!bVar3) {
      return wVar5;
    }
  }
  puVar7 = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_38);
  if ((long)local_38 < 0) {
    pcVar9 = "Truncated xz file body";
    error_number = 0x54;
LAB_001632e1:
    archive_set_error(&a->archive,error_number,pcVar9);
    goto LAB_00163318;
  }
  if (zip->entry_bytes_remaining < (long)local_38) {
    local_38 = zip->entry_bytes_remaining;
  }
  (zip->zipx_lzma_stream).next_in = puVar7;
  (zip->zipx_lzma_stream).avail_in = local_38;
  (zip->zipx_lzma_stream).total_in = 0;
  sVar2 = zip->uncompressed_buffer_size;
  (zip->zipx_lzma_stream).next_out = zip->uncompressed_buffer;
  (zip->zipx_lzma_stream).avail_out = sVar2;
  (zip->zipx_lzma_stream).total_out = 0;
  lVar4 = lzma_code(&zip->zipx_lzma_stream,LZMA_RUN);
  switch(lVar4) {
  case LZMA_STREAM_END:
    lzma_end(&zip->zipx_lzma_stream);
    zip->zipx_lzma_valid = '\0';
    if ((zip->zipx_lzma_stream).total_in != zip->entry_bytes_remaining) {
      pcVar9 = "xz premature end of stream";
      error_number = -1;
      goto LAB_001632e1;
    }
    zip->end_of_entry = '\x01';
  case LZMA_OK:
  case LZMA_NO_CHECK:
    uVar1 = (zip->zipx_lzma_stream).total_in;
    __archive_read_consume(a,uVar1);
    zip->entry_bytes_remaining = zip->entry_bytes_remaining - uVar1;
    zip->entry_compressed_bytes_read = zip->entry_compressed_bytes_read + uVar1;
    uVar1 = (zip->zipx_lzma_stream).total_out;
    zip->entry_uncompressed_bytes_read = zip->entry_uncompressed_bytes_read + uVar1;
    *size = uVar1;
    *buff = zip->uncompressed_buffer;
    wVar5 = consume_optional_marker(a,zip);
    break;
  default:
    pcVar9 = "xz unknown error %d";
    uVar8 = (ulong)lVar4;
    goto LAB_00163311;
  case LZMA_DATA_ERROR:
    pcVar9 = "xz data error (error %d)";
    uVar8 = 9;
LAB_00163311:
    archive_set_error(&a->archive,-1,pcVar9,uVar8);
LAB_00163318:
    wVar5 = L'\xffffffe2';
  }
  return wVar5;
}

Assistant:

static int
zip_read_data_zipx_xz(struct archive_read *a, const void **buff,
	size_t *size, int64_t *offset)
{
	struct zip* zip = (struct zip *)(a->format->data);
	int ret;
	lzma_ret lz_ret;
	const void* compressed_buf;
	ssize_t bytes_avail, in_bytes, to_consume = 0;

	(void) offset; /* UNUSED */

	/* Initialize decompressor if not yet initialized. */
	if (!zip->decompress_init) {
		ret = zipx_xz_init(a, zip);
		if (ret != ARCHIVE_OK)
			return (ret);
	}

	compressed_buf = __archive_read_ahead(a, 1, &bytes_avail);
	if (bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated xz file body");
		return (ARCHIVE_FATAL);
	}

	in_bytes = zipmin(zip->entry_bytes_remaining, bytes_avail);
	zip->zipx_lzma_stream.next_in = compressed_buf;
	zip->zipx_lzma_stream.avail_in = in_bytes;
	zip->zipx_lzma_stream.total_in = 0;
	zip->zipx_lzma_stream.next_out = zip->uncompressed_buffer;
	zip->zipx_lzma_stream.avail_out = zip->uncompressed_buffer_size;
	zip->zipx_lzma_stream.total_out = 0;

	/* Perform the decompression. */
	lz_ret = lzma_code(&zip->zipx_lzma_stream, LZMA_RUN);
	switch(lz_ret) {
		case LZMA_DATA_ERROR:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "xz data error (error %d)", (int) lz_ret);
			return (ARCHIVE_FATAL);

		case LZMA_NO_CHECK:
		case LZMA_OK:
			break;

		default:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "xz unknown error %d", (int) lz_ret);
			return (ARCHIVE_FATAL);

		case LZMA_STREAM_END:
			lzma_end(&zip->zipx_lzma_stream);
			zip->zipx_lzma_valid = 0;

			if((int64_t) zip->zipx_lzma_stream.total_in !=
			    zip->entry_bytes_remaining)
			{
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "xz premature end of stream");
				return (ARCHIVE_FATAL);
			}

			zip->end_of_entry = 1;
			break;
	}

	to_consume = zip->zipx_lzma_stream.total_in;

	__archive_read_consume(a, to_consume);
	zip->entry_bytes_remaining -= to_consume;
	zip->entry_compressed_bytes_read += to_consume;
	zip->entry_uncompressed_bytes_read += zip->zipx_lzma_stream.total_out;

	*size = zip->zipx_lzma_stream.total_out;
	*buff = zip->uncompressed_buffer;

	ret = consume_optional_marker(a, zip);
	if (ret != ARCHIVE_OK)
		return (ret);

	return (ARCHIVE_OK);
}